

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.c
# Opt level: O0

void uv__chld(uv_signal_t *handle,int signum)

{
  long ***ppplVar1;
  undefined8 *puVar2;
  int *piVar3;
  int in_ESI;
  long in_RDI;
  bool bVar4;
  QUEUE *q;
  QUEUE *h;
  QUEUE pending;
  pid_t pid;
  int status;
  uint i;
  int term_signal;
  int exit_status;
  uv_loop_t *loop;
  uv_process_t *process;
  undefined8 *local_58;
  long ***local_48;
  long ***local_40;
  __pid_t local_34;
  int local_30;
  int local_2c;
  uint local_28;
  int local_24;
  long local_20;
  long ***local_18;
  
  if (in_ESI != 0x11) {
    __assert_fail("signum == SIGCHLD","src/unix/process.c",0x3e,"void uv__chld(uv_signal_t *, int)")
    ;
  }
  local_48 = (long ***)&local_48;
  local_40 = (long ***)&local_48;
  local_20 = *(long *)(in_RDI + 0x10);
  local_2c = 0;
  do {
    if (local_2c != 0) {
      return;
    }
    puVar2 = (undefined8 *)(local_20 + 0x118);
    local_58 = (undefined8 *)*puVar2;
    while (local_58 != puVar2) {
      local_18 = (long ***)(local_58 + -10);
      local_58 = (undefined8 *)*local_58;
      do {
        local_34 = waitpid(*(__pid_t *)(local_18 + 9),&local_30,1);
        bVar4 = false;
        if (local_34 == -1) {
          piVar3 = __errno_location();
          bVar4 = *piVar3 == 4;
        }
      } while (bVar4);
      if (local_34 != 0) {
        if (local_34 == -1) {
          piVar3 = __errno_location();
          if (*piVar3 != 10) {
            abort();
          }
        }
        else {
          *(int *)(local_18 + 0xc) = local_30;
          *local_18[0xb] = (long *)local_18[10];
          *(long ***)((long)local_18[10] + 8) = local_18[0xb];
          local_18[10] = (long **)&local_48;
          local_18[0xb] = (long **)local_40;
          *local_18[0xb] = (long *)(local_18 + 10);
          local_40 = local_18 + 10;
        }
      }
    }
    while (ppplVar1 = local_48, &local_48 != (long ****)local_48) {
      *local_48[1] = (long *)*local_48;
      (*local_48)[1] = (long *)local_48[1];
      *local_48 = (long **)local_48;
      ppplVar1[1] = (long **)ppplVar1;
      local_18 = ppplVar1 + -10;
      if ((((ulong)ppplVar1[-4] & 0x4000) != 0) &&
         (*(uint *)(ppplVar1 + -4) = *(uint *)(ppplVar1 + -4) & 0xffffbfff,
         ((ulong)local_18[6] & 0x2000) != 0)) {
        *(int *)(local_18[2] + 1) = *(int *)(local_18[2] + 1) + -1;
      }
      if ((long ***)local_18[8] != (long ***)0x0) {
        local_24 = 0;
        if (((ulong)local_18[0xc] & 0x7f) == 0) {
          local_24 = (int)(*(uint *)(local_18 + 0xc) & 0xff00) >> 8;
        }
        local_28 = 0;
        if ('\0' < (char)(((byte)*(undefined4 *)(local_18 + 0xc) & 0x7f) + 1) >> 1) {
          local_28 = *(uint *)(local_18 + 0xc) & 0x7f;
        }
        (*(code *)local_18[8])(local_18,local_24,local_28);
      }
    }
    local_2c = local_2c + 1;
  } while( true );
}

Assistant:

static void uv__chld(uv_signal_t* handle, int signum) {
  uv_process_t* process;
  uv_loop_t* loop;
  int exit_status;
  int term_signal;
  unsigned int i;
  int status;
  pid_t pid;
  QUEUE pending;
  QUEUE* h;
  QUEUE* q;

  assert(signum == SIGCHLD);

  QUEUE_INIT(&pending);
  loop = handle->loop;

  for (i = 0; i < ARRAY_SIZE(loop->process_handles); i++) {
    h = loop->process_handles + i;
    q = QUEUE_HEAD(h);

    while (q != h) {
      process = QUEUE_DATA(q, uv_process_t, queue);
      q = QUEUE_NEXT(q);

      do
        pid = waitpid(process->pid, &status, WNOHANG);
      while (pid == -1 && errno == EINTR);

      if (pid == 0)
        continue;

      if (pid == -1) {
        if (errno != ECHILD)
          abort();
        continue;
      }

      process->status = status;
      QUEUE_REMOVE(&process->queue);
      QUEUE_INSERT_TAIL(&pending, &process->queue);
    }

    while (!QUEUE_EMPTY(&pending)) {
      q = QUEUE_HEAD(&pending);
      QUEUE_REMOVE(q);
      QUEUE_INIT(q);

      process = QUEUE_DATA(q, uv_process_t, queue);
      uv__handle_stop(process);

      if (process->exit_cb == NULL)
        continue;

      exit_status = 0;
      if (WIFEXITED(process->status))
        exit_status = WEXITSTATUS(process->status);

      term_signal = 0;
      if (WIFSIGNALED(process->status))
        term_signal = WTERMSIG(process->status);

      process->exit_cb(process, exit_status, term_signal);
    }
  }
}